

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase
               (ostream *stream,TestCase *test_case)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  internal *this;
  TestResult *this_00;
  TestInfo *pTVar5;
  TimeInMillis ms;
  TestResult *result;
  int local_24c;
  undefined1 local_248 [4];
  int i;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  int local_18c;
  string local_188;
  allocator local_161;
  string local_160;
  int local_13c;
  string local_138;
  allocator local_111;
  string local_110;
  int local_ec;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string kTestsuite;
  TestCase *test_case_local;
  ostream *stream_local;
  
  kTestsuite.field_2._8_8_ = test_case;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"testsuite",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar3 = std::operator<<(stream,"  <");
  std::operator<<(poVar3,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  pcVar4 = TestCase::name((TestCase *)kTestsuite.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,pcVar4,&local_99);
  OutputXmlAttribute(stream,(string *)local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"tests",&local_c1);
  local_ec = TestCase::reportable_test_count((TestCase *)kTestsuite.field_2._8_8_);
  StreamableToString<int>(&local_e8,&local_ec);
  OutputXmlAttribute(stream,(string *)local_38,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"failures",&local_111);
  local_13c = TestCase::failed_test_count((TestCase *)kTestsuite.field_2._8_8_);
  StreamableToString<int>(&local_138,&local_13c);
  OutputXmlAttribute(stream,(string *)local_38,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"disabled",&local_161);
  local_18c = TestCase::reportable_disabled_test_count((TestCase *)kTestsuite.field_2._8_8_);
  StreamableToString<int>(&local_188,&local_18c);
  OutputXmlAttribute(stream,(string *)local_38,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"errors",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"0",&local_1d9);
  OutputXmlAttribute(stream,(string *)local_38,&local_1b0,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"time",&local_201);
  this = (internal *)TestCase::elapsed_time((TestCase *)kTestsuite.field_2._8_8_);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_228,this,ms);
  OutputXmlAttribute(stream,(string *)local_38,&local_200,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  this_00 = TestCase::ad_hoc_test_result((TestCase *)kTestsuite.field_2._8_8_);
  TestPropertiesAsXmlAttributes_abi_cxx11_
            ((string *)local_248,(XmlUnitTestResultPrinter *)this_00,result);
  poVar3 = std::operator<<(stream,(string *)local_248);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)local_248);
  for (local_24c = 0; iVar2 = TestCase::total_test_count((TestCase *)kTestsuite.field_2._8_8_),
      local_24c < iVar2; local_24c = local_24c + 1) {
    pTVar5 = TestCase::GetTestInfo((TestCase *)kTestsuite.field_2._8_8_,local_24c);
    bVar1 = TestInfo::is_reportable(pTVar5);
    if (bVar1) {
      pcVar4 = TestCase::name((TestCase *)kTestsuite.field_2._8_8_);
      pTVar5 = TestCase::GetTestInfo((TestCase *)kTestsuite.field_2._8_8_,local_24c);
      OutputXmlTestInfo(stream,pcVar4,pTVar5);
    }
  }
  poVar3 = std::operator<<(stream,"  </");
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(std::ostream* stream,
                                                const TestCase& test_case) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_case.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_case.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "failures",
                     StreamableToString(test_case.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuite, "disabled",
      StreamableToString(test_case.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuite, "errors", "0");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(test_case.elapsed_time()));
  *stream << TestPropertiesAsXmlAttributes(test_case.ad_hoc_test_result())
          << ">\n";

  for (int i = 0; i < test_case.total_test_count(); ++i) {
    if (test_case.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_case.name(), *test_case.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}